

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall trieste::NodeDef::push_back_ephemeral(NodeDef *this,NodeRange range)

{
  __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
  _Var1;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  for (_Var1 = range.first._M_current; _Var1._M_current != range.second._M_current._M_current;
      _Var1._M_current =
           (shared_ptr<trieste::NodeDef> *)
           (&(_Var1._M_current)->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> +
           1)) {
    std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_38,
               &(_Var1._M_current)->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
              );
    push_back_ephemeral(this,(Node *)&_Stack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  }
  return;
}

Assistant:

void push_back_ephemeral(NodeRange range)
    {
      for (auto it = range.first; it != range.second; ++it)
        push_back_ephemeral(*it);
    }